

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_real(void)

{
  bool bVar1;
  uchar (*in_RDX) [5];
  uchar (*input_00) [9];
  undefined8 local_c0;
  type_conflict9 local_b8 [2];
  undefined1 local_a8 [8];
  basic_variable<std::allocator<char>_> result_1;
  undefined8 local_70;
  value_type input_1 [9];
  type_conflict8 local_5c [5];
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  undefined4 local_10;
  undefined1 local_c;
  value_type input [5];
  
  local_c = 0x3f;
  local_10 = 0x800000c5;
  trial::protocol::bintoken::parse<unsigned_char[5],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,(bintoken *)&local_10,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                    ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.same<float>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x6c,"void parser_suite::parse_real()",bVar1);
  local_5c[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<float>
                          ((basic_variable<std::allocator<char>_> *)local_48);
  stack0xffffffffffffffa0 = 0x3f800000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,float,float>
            ("result.value<float>()","1.0f",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x6d,"void parser_suite::parse_real()",local_5c,input_1 + 8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  local_70 = 0xf0000000000000d7;
  input_1[0] = '?';
  trial::protocol::bintoken::parse<unsigned_char[9],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_a8,(bintoken *)&local_70,input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<double>
                    ((basic_variable<std::allocator<char>_> *)local_a8);
  boost::detail::test_impl
            ("result.same<double>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x73,"void parser_suite::parse_real()",bVar1);
  local_b8[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<double>
                          ((basic_variable<std::allocator<char>_> *)local_a8);
  local_c0 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("result.value<double>()","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x74,"void parser_suite::parse_real()",local_b8,&local_c0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_a8);
  return;
}

Assistant:

void parse_real()
{
    // float32
    {
        const value_type input[] = { bintoken::token::code::float32, 0x00, 0x00, 0x80, 0x3F };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<float>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<float>(), 1.0f);
    }
    // float64
    {
        const value_type input[] = { bintoken::token::code::float64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<double>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<double>(), 1.0);
    }
}